

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Parser::parseArray(Parser *this)

{
  int iVar1;
  Exception *this_00;
  int iVar2;
  
  Builder::addCompoundValue(this->_builderPtr,'\x06');
  increaseNesting(this);
  iVar2 = 0x11b750;
  iVar1 = skipWhiteSpace(this,"Expecting item or \']\'");
  if (iVar1 == 0x5d) {
    this->_pos = this->_pos + 1;
    this->_nesting = this->_nesting - 1;
    Builder::close(this->_builderPtr,iVar2);
    return;
  }
  while( true ) {
    Builder::reportAdd(this->_builderPtr);
    parseJson(this);
    iVar2 = 0x11b766;
    iVar1 = skipWhiteSpace(this,"Expecting \',\' or \']\'");
    if (iVar1 == 0x5d) {
      this->_pos = this->_pos + 1;
      Builder::close(this->_builderPtr,iVar2);
      this->_nesting = this->_nesting - 1;
      return;
    }
    if (iVar1 != 0x2c) break;
    this->_pos = this->_pos + 1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,ParseError,"Expecting \',\' or \']\'");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Parser::parseArray() {
  _builderPtr->addArray();

  increaseNesting();

  int i = skipWhiteSpace("Expecting item or ']'");
  if (i == ']') {
    // empty array
    ++_pos;  // the closing ']'
    decreaseNesting();
    _builderPtr->close();
    return;
  }

  while (true) {
    // parse array element itself
    _builderPtr->reportAdd();
    parseJson();
    i = skipWhiteSpace("Expecting ',' or ']'");
    if (i == ']') {
      // end of array
      ++_pos;  // the closing ']'
      _builderPtr->close();
      decreaseNesting();
      return;
    }
    // skip over ','
    if (VELOCYPACK_UNLIKELY(i != ',')) {
      throw Exception(Exception::ParseError, "Expecting ',' or ']'");
    }
    ++_pos;  // the ','
  }

  // should never get here
  VELOCYPACK_ASSERT(false);
}